

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

string * unicode_byte_to_utf8_abi_cxx11_(uint8_t byte)

{
  int iVar1;
  mapped_type *pmVar2;
  string *in_RDI;
  key_type *in_stack_ffffffffffffffc8;
  string *this;
  
  this = in_RDI;
  if (unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_);
    if (iVar1 != 0) {
      unicode_byte_to_utf8_map_abi_cxx11_();
      __cxa_atexit(std::
                   unordered_map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_);
    }
  }
  pmVar2 = std::
           unordered_map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((unordered_map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this,in_stack_ffffffffffffffc8);
  std::__cxx11::string::string((string *)this,(string *)pmVar2);
  return in_RDI;
}

Assistant:

std::string unicode_byte_to_utf8(uint8_t byte) {
    static std::unordered_map<uint8_t, std::string> map = unicode_byte_to_utf8_map();
    return map.at(byte);
}